

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

void __thiscall Fl_Tabs::redraw_tabs(Fl_Tabs *this)

{
  int iVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int W;
  int H;
  Fl_Tabs *this_local;
  
  iVar1 = tab_height(this);
  if (iVar1 < 0) {
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar3 = Fl::box_dy(FVar2);
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl_Widget::y((Fl_Widget *)this);
    iVar6 = Fl_Widget::h((Fl_Widget *)this);
    W = Fl_Widget::w((Fl_Widget *)this);
    Fl_Widget::damage((Fl_Widget *)this,'\x04',iVar4,(iVar5 + iVar6) - (iVar3 - iVar1),W,
                      iVar3 - iVar1);
  }
  else {
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar3 = Fl::box_dy(FVar2);
    iVar4 = Fl_Widget::x((Fl_Widget *)this);
    iVar5 = Fl_Widget::y((Fl_Widget *)this);
    iVar6 = Fl_Widget::w((Fl_Widget *)this);
    Fl_Widget::damage((Fl_Widget *)this,'\x04',iVar4,iVar5,iVar6,iVar3 + iVar1);
  }
  return;
}

Assistant:

void Fl_Tabs::redraw_tabs()
{
  int H = tab_height();
  if (H >= 0) {
    H += Fl::box_dy(box());
    damage(FL_DAMAGE_SCROLL, x(), y(), w(), H);
  } else {
    H = Fl::box_dy(box()) - H;
    damage(FL_DAMAGE_SCROLL, x(), y() + h() - H, w(), H);
  }
}